

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::ParseTextureNameAndOption(string *texname,texture_option_t *texopt,char *linebuf)

{
  texture_option_t *ptVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long *extraout_RAX;
  long *plVar5;
  texture_type_t tVar6;
  byte bVar7;
  byte *pbVar8;
  byte *pbVar9;
  bool bVar10;
  size_type *local_a0;
  string texture_name;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  long *local_58 [2];
  long local_48 [2];
  texture_option_t *local_38;
  
  local_a0 = &texture_name._M_string_length;
  texture_name._M_dataplus._M_p = (pointer)0x0;
  texture_name._M_string_length._0_1_ = 0;
  texture_name.field_2._8_8_ = 0;
  local_38 = texopt;
LAB_00110482:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if (((byte)*linebuf < 0xe) && ((0x2401U >> ((byte)*linebuf & 0x1f) & 1) != 0)) {
              bVar7 = (byte)texture_name.field_2._8_8_;
              if ((texture_name.field_2._8_8_ & 1) != 0) {
                std::__cxx11::string::_M_assign((string *)texname);
              }
              if (local_a0 != &texture_name._M_string_length) {
                operator_delete(local_a0,CONCAT71(texture_name._M_string_length._1_7_,
                                                  (undefined1)texture_name._M_string_length) + 1);
              }
              return (bool)(bVar7 & 1);
            }
            sVar3 = strspn(linebuf," \t");
            pbVar8 = (byte *)linebuf + sVar3;
            iVar2 = strncmp((char *)pbVar8,"-blendu",7);
            if ((iVar2 != 0) || ((pbVar8[7] != 0x20 && (pbVar8[7] != 9)))) break;
            sVar3 = strspn((char *)(pbVar8 + 8)," \t");
            pbVar9 = pbVar8 + sVar3 + 8;
            sVar4 = strcspn((char *)pbVar9," \t\r");
            bVar10 = true;
            if ((*pbVar9 == 0x6f) && (pbVar8[sVar3 + 9] == 0x66)) {
              bVar10 = pbVar8[sVar3 + 10] != 0x66;
            }
            linebuf = (char *)(pbVar9 + sVar4);
            local_38->blendu = bVar10;
          }
          iVar2 = strncmp((char *)pbVar8,"-blendv",7);
          if ((iVar2 != 0) || ((pbVar8[7] != 0x20 && (pbVar8[7] != 9)))) break;
          sVar3 = strspn((char *)(pbVar8 + 8)," \t");
          pbVar9 = pbVar8 + sVar3 + 8;
          sVar4 = strcspn((char *)pbVar9," \t\r");
          bVar10 = true;
          if ((*pbVar9 == 0x6f) && (pbVar8[sVar3 + 9] == 0x66)) {
            bVar10 = pbVar8[sVar3 + 10] != 0x66;
          }
          linebuf = (char *)(pbVar9 + sVar4);
          local_38->blendv = bVar10;
        }
        iVar2 = strncmp((char *)pbVar8,"-clamp",6);
        if ((iVar2 != 0) || ((pbVar8[6] != 0x20 && (pbVar8[6] != 9)))) break;
        sVar3 = strspn((char *)(pbVar8 + 7)," \t");
        pbVar9 = pbVar8 + sVar3 + 7;
        sVar4 = strcspn((char *)pbVar9," \t\r");
        bVar10 = true;
        if ((*pbVar9 == 0x6f) && (pbVar8[sVar3 + 8] == 0x66)) {
          bVar10 = pbVar8[sVar3 + 9] != 0x66;
        }
        linebuf = (char *)(pbVar9 + sVar4);
        local_38->clamp = bVar10;
      }
      iVar2 = strncmp((char *)pbVar8,"-boost",6);
      if ((iVar2 != 0) || ((pbVar8[6] != 0x20 && (pbVar8[6] != 9)))) break;
      sVar3 = strspn((char *)(pbVar8 + 7)," \t");
      pbVar8 = pbVar8 + sVar3 + 7;
      sVar3 = strcspn((char *)pbVar8," \t\r");
      linebuf = (char *)(pbVar8 + sVar3);
      local_58[0] = (long *)0x3ff0000000000000;
      tryParseDouble((char *)pbVar8,linebuf,(double *)local_58);
      local_38->sharpness = (float)(double)local_58[0];
    }
    bVar7 = *pbVar8;
    if (bVar7 == 0x2d) {
      if (((pbVar8[1] == 0x62) && (pbVar8[2] == 0x6d)) && ((pbVar8[3] == 0x20 || (pbVar8[3] == 9))))
      {
        sVar3 = strspn((char *)(pbVar8 + 4)," \t");
        pbVar8 = pbVar8 + sVar3 + 4;
        sVar3 = strcspn((char *)pbVar8," \t\r");
        linebuf = (char *)(pbVar8 + sVar3);
        local_58[0] = (long *)0x3ff0000000000000;
        tryParseDouble((char *)pbVar8,linebuf,(double *)local_58);
        local_38->bump_multiplier = (float)(double)local_58[0];
        goto LAB_00110482;
      }
      if ((pbVar8[1] == 0x6f) && ((pbVar8[2] == 0x20 || (pbVar8[2] == 9)))) {
        sVar3 = strspn((char *)(pbVar8 + 3)," \t");
        ptVar1 = local_38;
        pbVar8 = pbVar8 + sVar3 + 3;
        sVar3 = strcspn((char *)pbVar8," \t\r");
        pbVar9 = pbVar8 + sVar3;
        local_58[0] = (long *)0x0;
        tryParseDouble((char *)pbVar8,(char *)pbVar9,(double *)local_58);
        ptVar1->origin_offset[0] = (float)(double)local_58[0];
        sVar3 = strspn((char *)pbVar9," \t");
        pbVar9 = pbVar9 + sVar3;
        sVar3 = strcspn((char *)pbVar9," \t\r");
        pbVar8 = pbVar9 + sVar3;
        local_58[0] = (long *)0x0;
        tryParseDouble((char *)pbVar9,(char *)pbVar8,(double *)local_58);
        ptVar1->origin_offset[1] = (float)(double)local_58[0];
        sVar3 = strspn((char *)pbVar8," \t");
        pbVar8 = pbVar8 + sVar3;
        sVar3 = strcspn((char *)pbVar8," \t\r");
        linebuf = (char *)(pbVar8 + sVar3);
        local_58[0] = (long *)0x0;
        tryParseDouble((char *)pbVar8,linebuf,(double *)local_58);
        ptVar1->origin_offset[2] = (float)(double)local_58[0];
        goto LAB_00110482;
      }
      if ((pbVar8[1] == 0x73) && ((pbVar8[2] == 0x20 || (pbVar8[2] == 9)))) {
        sVar3 = strspn((char *)(pbVar8 + 3)," \t");
        pbVar8 = pbVar8 + sVar3 + 3;
        sVar3 = strcspn((char *)pbVar8," \t\r");
        pbVar9 = pbVar8 + sVar3;
        local_58[0] = (long *)0x3ff0000000000000;
        tryParseDouble((char *)pbVar8,(char *)pbVar9,(double *)local_58);
        local_38->scale[0] = (float)(double)local_58[0];
        sVar3 = strspn((char *)pbVar9," \t");
        pbVar9 = pbVar9 + sVar3;
        sVar3 = strcspn((char *)pbVar9," \t\r");
        pbVar8 = pbVar9 + sVar3;
        local_58[0] = (long *)0x3ff0000000000000;
        tryParseDouble((char *)pbVar9,(char *)pbVar8,(double *)local_58);
        local_38->scale[1] = (float)(double)local_58[0];
        sVar3 = strspn((char *)pbVar8," \t");
        pbVar8 = pbVar8 + sVar3;
        sVar3 = strcspn((char *)pbVar8," \t\r");
        linebuf = (char *)(pbVar8 + sVar3);
        local_58[0] = (long *)0x3ff0000000000000;
        tryParseDouble((char *)pbVar8,linebuf,(double *)local_58);
        local_38->scale[2] = (float)(double)local_58[0];
        goto LAB_00110482;
      }
      if ((pbVar8[1] == 0x74) && ((pbVar8[2] == 0x20 || (pbVar8[2] == 9)))) {
        sVar3 = strspn((char *)(pbVar8 + 3)," \t");
        pbVar8 = pbVar8 + sVar3 + 3;
        sVar3 = strcspn((char *)pbVar8," \t\r");
        pbVar9 = pbVar8 + sVar3;
        local_58[0] = (long *)0x0;
        tryParseDouble((char *)pbVar8,(char *)pbVar9,(double *)local_58);
        local_38->turbulence[0] = (float)(double)local_58[0];
        sVar3 = strspn((char *)pbVar9," \t");
        pbVar9 = pbVar9 + sVar3;
        sVar3 = strcspn((char *)pbVar9," \t\r");
        pbVar8 = pbVar9 + sVar3;
        local_58[0] = (long *)0x0;
        tryParseDouble((char *)pbVar9,(char *)pbVar8,(double *)local_58);
        local_38->turbulence[1] = (float)(double)local_58[0];
        sVar3 = strspn((char *)pbVar8," \t");
        pbVar8 = pbVar8 + sVar3;
        sVar3 = strcspn((char *)pbVar8," \t\r");
        linebuf = (char *)(pbVar8 + sVar3);
        local_58[0] = (long *)0x0;
        tryParseDouble((char *)pbVar8,linebuf,(double *)local_58);
        local_38->turbulence[2] = (float)(double)local_58[0];
        goto LAB_00110482;
      }
    }
    iVar2 = strncmp((char *)pbVar8,"-type",5);
    if ((iVar2 == 0) && ((pbVar8[5] == 0x20 || (pbVar8[5] == 9)))) {
      sVar3 = strspn((char *)(pbVar8 + 5)," \t");
      pbVar8 = pbVar8 + 5 + sVar3;
      sVar3 = strcspn((char *)pbVar8," \t\r");
      iVar2 = strncmp((char *)pbVar8,"cube_top",8);
      if (iVar2 == 0) {
        tVar6 = TEXTURE_TYPE_CUBE_TOP;
      }
      else {
        iVar2 = strncmp((char *)pbVar8,"cube_bottom",0xb);
        if (iVar2 == 0) {
          tVar6 = TEXTURE_TYPE_CUBE_BOTTOM;
        }
        else {
          iVar2 = strncmp((char *)pbVar8,"cube_left",9);
          if (iVar2 == 0) {
            tVar6 = TEXTURE_TYPE_CUBE_LEFT;
          }
          else {
            iVar2 = strncmp((char *)pbVar8,"cube_right",10);
            if (iVar2 == 0) {
              tVar6 = TEXTURE_TYPE_CUBE_RIGHT;
            }
            else {
              iVar2 = strncmp((char *)pbVar8,"cube_front",10);
              if (iVar2 == 0) {
                tVar6 = TEXTURE_TYPE_CUBE_FRONT;
              }
              else {
                iVar2 = strncmp((char *)pbVar8,"cube_back",9);
                if (iVar2 == 0) {
                  tVar6 = TEXTURE_TYPE_CUBE_BACK;
                }
                else {
                  iVar2 = strncmp((char *)pbVar8,"sphere",6);
                  tVar6 = (texture_type_t)(iVar2 == 0);
                }
              }
            }
          }
        }
      }
      linebuf = (char *)(pbVar8 + sVar3);
      local_38->type = tVar6;
    }
    else {
      iVar2 = strncmp((char *)pbVar8,"-texres",7);
      if ((iVar2 == 0) && ((pbVar8[7] == 0x20 || (pbVar8[7] == 9)))) {
        sVar3 = strspn((char *)(pbVar8 + 7)," \t");
        pbVar8 = pbVar8 + 7 + sVar3;
        iVar2 = atoi((char *)pbVar8);
        sVar3 = strcspn((char *)pbVar8," \t\r");
        linebuf = (char *)(pbVar8 + sVar3);
        local_38->texture_resolution = iVar2;
      }
      else {
        iVar2 = strncmp((char *)pbVar8,"-imfchan",8);
        if ((iVar2 == 0) && ((pbVar8[8] == 0x20 || (pbVar8[8] == 9)))) {
          sVar3 = strspn((char *)(pbVar8 + 9)," \t");
          pbVar8 = pbVar8 + sVar3 + 9;
          sVar3 = strcspn((char *)pbVar8," \t\r");
          linebuf = (char *)(pbVar8 + sVar3);
          if (sVar3 == 1) {
            local_38->imfchan = *pbVar8;
          }
        }
        else if ((((bVar7 == 0x2d) && (pbVar8[1] == 0x6d)) && (pbVar8[2] == 0x6d)) &&
                ((pbVar8[3] == 0x20 || (pbVar8[3] == 9)))) {
          sVar3 = strspn((char *)(pbVar8 + 4)," \t");
          ptVar1 = local_38;
          pbVar8 = pbVar8 + sVar3 + 4;
          sVar3 = strcspn((char *)pbVar8," \t\r");
          pbVar9 = pbVar8 + sVar3;
          local_58[0] = (long *)0x0;
          tryParseDouble((char *)pbVar8,(char *)pbVar9,(double *)local_58);
          ptVar1->brightness = (float)(double)local_58[0];
          sVar3 = strspn((char *)pbVar9," \t");
          pbVar9 = pbVar9 + sVar3;
          sVar3 = strcspn((char *)pbVar9," \t\r");
          linebuf = (char *)(pbVar9 + sVar3);
          local_58[0] = (long *)0x3ff0000000000000;
          tryParseDouble((char *)pbVar9,linebuf,(double *)local_58);
          ptVar1->contrast = (float)(double)local_58[0];
        }
        else {
          iVar2 = strncmp((char *)pbVar8,"-colorspace",0xb);
          if ((iVar2 == 0) && ((pbVar8[0xb] == 0x20 || (pbVar8[0xb] == 9)))) {
            local_78 = &local_68;
            local_70 = 0;
            local_68 = 0;
            sVar3 = strspn((char *)(pbVar8 + 0xc)," \t");
            pbVar8 = pbVar8 + sVar3 + 0xc;
            sVar3 = strcspn((char *)pbVar8," \t\r");
            linebuf = (char *)(pbVar8 + sVar3);
            local_58[0] = local_48;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pbVar8,linebuf);
            std::__cxx11::string::operator=((string *)&local_78,(string *)local_58);
            if (local_58[0] != local_48) {
              operator_delete(local_58[0],local_48[0] + 1);
            }
            std::__cxx11::string::operator=((string *)&texopt->colorspace,(string *)&local_78);
            if (local_78 != &local_68) {
              operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
            }
          }
          else {
            std::__cxx11::string::string((string *)local_58,(char *)pbVar8,(allocator *)&local_78);
            std::__cxx11::string::operator=((string *)&local_a0,(string *)local_58);
            plVar5 = local_48;
            if (local_58[0] != plVar5) {
              operator_delete(local_58[0],local_48[0] + 1);
              plVar5 = extraout_RAX;
            }
            linebuf = (char *)(pbVar8 + (long)texture_name._M_dataplus._M_p);
            texture_name.field_2._8_8_ = CONCAT71((int7)((ulong)plVar5 >> 8),1);
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool ParseTextureNameAndOption(std::string *texname, texture_option_t *texopt,
                               const char *linebuf) {
  // @todo { write more robust lexer and parser. }
  bool found_texname = false;
  std::string texture_name;

  const char *token = linebuf;  // Assume line ends with NULL

  while (!IS_NEW_LINE((*token))) {
    token += strspn(token, " \t");  // skip space
    if ((0 == strncmp(token, "-blendu", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendu = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-blendv", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendv = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-clamp", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->clamp = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-boost", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->sharpness = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-bm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      texopt->bump_multiplier = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-o", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->origin_offset[0]), &(texopt->origin_offset[1]),
                 &(texopt->origin_offset[2]), &token);
    } else if ((0 == strncmp(token, "-s", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->scale[0]), &(texopt->scale[1]), &(texopt->scale[2]),
                 &token, 1.0, 1.0, 1.0);
    } else if ((0 == strncmp(token, "-t", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->turbulence[0]), &(texopt->turbulence[1]),
                 &(texopt->turbulence[2]), &token);
    } else if ((0 == strncmp(token, "-type", 5)) && IS_SPACE((token[5]))) {
      token += 5;
      texopt->type = parseTextureType((&token), TEXTURE_TYPE_NONE);
    } else if ((0 == strncmp(token, "-texres", 7)) && IS_SPACE((token[7]))) {
      token += 7;
      // TODO(syoyo): Check if arg is int type.
      texopt->texture_resolution = parseInt(&token);
    } else if ((0 == strncmp(token, "-imfchan", 8)) && IS_SPACE((token[8]))) {
      token += 9;
      token += strspn(token, " \t");
      const char *end = token + strcspn(token, " \t\r");
      if ((end - token) == 1) {  // Assume one char for -imfchan
        texopt->imfchan = (*token);
      }
      token = end;
    } else if ((0 == strncmp(token, "-mm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      parseReal2(&(texopt->brightness), &(texopt->contrast), &token, 0.0, 1.0);
    } else if ((0 == strncmp(token, "-colorspace", 11)) &&
               IS_SPACE((token[11]))) {
      token += 12;
      texopt->colorspace = parseString(&token);
    } else {
// Assume texture filename
#if 0
      size_t len = strcspn(token, " \t\r");  // untile next space
      texture_name = std::string(token, token + len);
      token += len;

      token += strspn(token, " \t");  // skip space
#else
      // Read filename until line end to parse filename containing whitespace
      // TODO(syoyo): Support parsing texture option flag after the filename.
      texture_name = std::string(token);
      token += texture_name.length();
#endif

      found_texname = true;
    }
  }

  if (found_texname) {
    (*texname) = texture_name;
    return true;
  } else {
    return false;
  }
}